

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_stbvorbis_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                           void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ma_result mVar3;
  
  mVar3 = ma_stbvorbis_init_internal((ma_decoding_backend_config *)pVorbis,(ma_stbvorbis *)onSeek);
  if (mVar3 == MA_SUCCESS) {
    if (onSeek == (ma_seek_proc)0x0 || onRead == (ma_read_proc)0x0) {
      mVar3 = MA_INVALID_ARGS;
    }
    else {
      pVorbis->onRead = onRead;
      pVorbis->onSeek = onSeek;
      pVorbis->onTell = onTell;
      pVorbis->pReadSeekTellUserData = pReadSeekTellUserData;
      ma_allocation_callbacks_init_copy(&pVorbis->allocationCallbacks,pAllocationCallbacks);
      mVar3 = ma_stbvorbis_init_internal_decoder_push(pVorbis);
      if (mVar3 == MA_SUCCESS) {
        pVorbis->usingPushMode = 1;
        uVar1 = pVorbis->stb->sample_rate;
        uVar2 = pVorbis->stb->channels;
        pVorbis->channels = uVar2;
        pVorbis->sampleRate = uVar1;
        mVar3 = MA_SUCCESS;
      }
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_stbvorbis_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pVorbis->onRead = onRead;
    pVorbis->onSeek = onSeek;
    pVorbis->onTell = onTell;
    pVorbis->pReadSeekTellUserData = pReadSeekTellUserData;
    ma_allocation_callbacks_init_copy(&pVorbis->allocationCallbacks, pAllocationCallbacks);

    #if !defined(MA_NO_VORBIS)
    {
        /*
        stb_vorbis lacks a callback based API for its pulling API which means we're stuck with the
        pushing API. In order for us to be able to successfully initialize the decoder we need to
        supply it with enough data. We need to keep loading data until we have enough.
        */
        result = ma_stbvorbis_init_internal_decoder_push(pVorbis);
        if (result != MA_SUCCESS) {
            return result;
        }

        pVorbis->usingPushMode = MA_TRUE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            ma_free(pVorbis->push.pData, pAllocationCallbacks);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}